

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void hrec_add_idx(bcf_hrec_t *hrec,int idx)

{
  size_t __size;
  char **ppcVar1;
  char *pcVar2;
  long lVar3;
  kstring_t str;
  kstring_t local_38;
  
  lVar3 = (long)hrec->nkeys;
  hrec->nkeys = hrec->nkeys + 1;
  __size = lVar3 * 8 + 8;
  ppcVar1 = (char **)realloc(hrec->keys,__size);
  hrec->keys = ppcVar1;
  ppcVar1 = (char **)realloc(hrec->vals,__size);
  hrec->vals = ppcVar1;
  pcVar2 = strdup("IDX");
  hrec->keys[lVar3] = pcVar2;
  local_38.l = 0;
  local_38.m = 0;
  local_38.s = (char *)0x0;
  kputw(idx,&local_38);
  hrec->vals[lVar3] = local_38.s;
  return;
}

Assistant:

void hrec_add_idx(bcf_hrec_t *hrec, int idx)
{
    int n = ++hrec->nkeys;
    hrec->keys = (char**) realloc(hrec->keys, sizeof(char*)*n);
    hrec->vals = (char**) realloc(hrec->vals, sizeof(char*)*n);
    hrec->keys[n-1] = strdup("IDX");
    kstring_t str = {0,0,0};
    kputw(idx, &str);
    hrec->vals[n-1] = str.s;
}